

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-parser.h
# Opt level: O0

int ORPG::Core::getopt_long(int argc,char **argv,char *optstring,option *longopts,int *index)

{
  FILE *__stream;
  int iVar1;
  char *__s;
  size_t sVar2;
  char *pcVar3;
  int local_54;
  uint local_50;
  int match;
  int current_argv_len;
  int i;
  char *has_equal;
  char *current_argv;
  int retval;
  int *index_local;
  option *longopts_local;
  char *optstring_local;
  char **argv_local;
  int argc_local;
  
  if (optstring == (char *)0x0) {
    return -1;
  }
  if (optind == 0) {
    optreset = 1;
    optind = 1;
  }
  current_argv._4_4_ = getopt_internal(argc,argv,optstring);
  if (current_argv._4_4_ == -2) {
    __s = argv[optind] + 2;
    local_54 = -1;
    if (*__s == '\0') {
      optind = optind + 1;
      return -1;
    }
    optind = optind + 1;
    _current_argv_len = strchr(__s,0x3d);
    if (_current_argv_len == (char *)0x0) {
      sVar2 = strlen(__s);
      local_50 = (uint)sVar2;
      _current_argv_len = (char *)0x0;
    }
    else {
      local_50 = (int)_current_argv_len - (int)__s;
      _current_argv_len = _current_argv_len + 1;
    }
    match = 0;
    while (longopts[match].name != (char *)0x0) {
      iVar1 = strncmp(__s,longopts[match].name,(long)(int)local_50);
      if (iVar1 == 0) {
        sVar2 = strlen(longopts[match].name);
        if (sVar2 == local_50) {
          local_54 = match;
          break;
        }
        if (local_54 == -1) {
          local_54 = match;
        }
      }
      match = match + 1;
    }
    __stream = _stderr;
    if (local_54 == -1) {
      if ((opterr != 0) && (*optstring != ':')) {
        pcVar3 = program_name(*argv);
        fprintf(__stream,"%s: illegal option -- %s\n",pcVar3,__s);
      }
      return 0x3f;
    }
    if ((longopts[local_54].has_arg == 1) || (longopts[local_54].has_arg == 2)) {
      if (_current_argv_len == (char *)0x0) {
        optarg = argv[optind];
        optind = optind + 1;
      }
      else {
        optarg = _current_argv_len;
      }
    }
    if ((longopts[local_54].has_arg == 1) && (optarg == (char *)0x0)) {
      if ((opterr != 0) && (*optstring != ':')) {
        pcVar3 = program_name(*argv);
        fprintf(__stream,"%s: option requires an argument -- %s\n",pcVar3,__s);
      }
      if (*optstring != ':') {
        return 0x3f;
      }
      return 0x3a;
    }
    if (longopts[local_54].flag == (int *)0x0) {
      current_argv._4_4_ = longopts[local_54].val;
    }
    else {
      *longopts[local_54].flag = longopts[local_54].val;
      current_argv._4_4_ = 0;
    }
    if (index != (int *)0x0) {
      *index = local_54;
    }
  }
  return current_argv._4_4_;
}

Assistant:

int getopt_long(int argc, char* argv[],
                        const char* optstring,
                        const struct option* longopts,
                        int* index) {
            if(optstring == NULL)
                return EOF;

            /* lets make sure we don't
            check the program name */
            if(optind == 0)
                optind = optreset = 1;

            int retval = EOF;

            if ((retval = getopt_internal(argc, argv, optstring)) == CONTINUE_CODE) {
                char *current_argv = argv[optind++] + 2, *has_equal;
                int i, current_argv_len, match = EOF;

                /* Check to make sure we have not reached a null ('\0') terminator*/
                if (*current_argv == '\0') return EOF;

                /* if our option has a '=' after it (i.e openrpg --roll=5d6)
                then do not count it in our length */
                if ((has_equal = strchr(current_argv, '=')) != NULL) {
                    current_argv_len = has_equal - current_argv;
                    has_equal++;
                } else
                    current_argv_len = strlen(current_argv);

                /* Check if our current option is in our list of longopts */
                for (i = 0; longopts[i].name; i++) {

                    /* Move though the list until we find a match */
                    if (strncmp(current_argv, longopts[i].name, current_argv_len))
                        continue;

                    if (strlen(longopts[i].name) == (unsigned)current_argv_len) {
                        match = i;

                        break;
                    }

                    /* something has gone wrong if we get here*/
                    if (match == EOF) match = i;
                }

                /* if we found a match then lets check if it has an argument */
                if (match != EOF) {
                    /* there could be an arguement! */
                    if (longopts[match].has_arg == required_argument ||
                        longopts[match].has_arg == optional_argument) {

                        /* if there was an equal ('=') then lets move to it
                        otherwise just increment by 1 */
                        if (has_equal)
                            optarg = has_equal;
                        else
                            optarg = argv[optind++];
                    }

                    /* if an argument is required lets make sure we have it*/
                    if ((longopts[match].has_arg == required_argument)
                        && (optarg == NULL)) {
                        /*
                        * Missing argument, leading :
                        * indicates no error should be generated
                        */
                        if ((opterr) && (*optstring != ':'))
                            fprintf(stderr,
                                    "%s: option requires an argument -- %s\n",
                                    program_name(argv[0]),
                                    current_argv);
                        return (((*optstring == ':') ? BADARG : BADCHAR));
                    }
                } else {
                    /* No matching argument */
                    if ((opterr) && (*optstring != ':'))
                        fprintf(stderr,
                                "%s: illegal option -- %s\n",
                                program_name(argv[0]),
                                current_argv);
                    return BADCHAR;
                }

                if (longopts[match].flag) {
                    *longopts[match].flag = longopts[match].val;
                    retval = 0;
                } else
                    retval = longopts[match].val;

                if (index)
                    *index = match;
            }

            return retval;
        }